

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O0

void __thiscall TPZGenPartialGrid::SetBC(TPZGenPartialGrid *this,TPZGeoMesh *g,int side,int bc)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int64_t iVar4;
  long *plVar5;
  TPZGeoElBC *this_00;
  TPZGeoEl *el_00;
  int in_EDX;
  TPZVec<int> *in_RDI;
  TPZGeoEl *gel;
  int64_t el;
  int64_t numel;
  TPZVec<long> cornernodes;
  TPZStack<int,_10> Sides;
  TPZStack<TPZGeoEl_*,_10> ElementVec;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  TPZGenPartialGrid *in_stack_fffffffffffffdf0;
  TPZGenPartialGrid *pTVar6;
  TPZStack<TPZGeoEl_*,_10> *in_stack_fffffffffffffe00;
  int64_t local_110;
  TPZVec<long> local_100;
  TPZStack<int,_10> *in_stack_ffffffffffffff30;
  TPZStack<TPZGeoEl_*,_10> *in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  int64_t in_stack_ffffffffffffff48;
  TPZGeoMesh *in_stack_ffffffffffffff50;
  TPZVec<TPZGeoEl_*> local_88 [3];
  int local_14;
  
  local_14 = in_EDX;
  if ((in_EDX != 0) || (piVar3 = TPZVec<int>::operator[](in_RDI + 2,0), *piVar3 == 0)) {
    if (local_14 == 1) {
      piVar3 = TPZVec<int>::operator[](in_RDI + 1,1);
      iVar1 = *piVar3;
      piVar3 = TPZVec<int>::operator[](in_RDI,0);
      if (iVar1 != *piVar3) {
        return;
      }
    }
    if (local_14 == 2) {
      piVar3 = TPZVec<int>::operator[](in_RDI + 2,1);
      iVar1 = *piVar3;
      piVar3 = TPZVec<int>::operator[](in_RDI,1);
      if (iVar1 != *piVar3) {
        return;
      }
    }
    if ((local_14 != 3) || (piVar3 = TPZVec<int>::operator[](in_RDI + 1,0), *piVar3 == 0)) {
      TPZStack<TPZGeoEl_*,_10>::TPZStack(in_stack_fffffffffffffe00);
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffffe00);
      TPZVec<long>::TPZVec
                ((TPZVec<long> *)in_stack_fffffffffffffdf0,
                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      TPZVec<int>::operator[](in_RDI + 1,0);
      TPZVec<int>::operator[](in_RDI + 2,0);
      iVar4 = NodeIndex(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                        in_stack_fffffffffffffde8);
      plVar5 = TPZVec<long>::operator[](&local_100,0);
      *plVar5 = iVar4;
      TPZVec<int>::operator[](in_RDI + 1,1);
      TPZVec<int>::operator[](in_RDI + 2,0);
      iVar4 = NodeIndex(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                        in_stack_fffffffffffffde8);
      plVar5 = TPZVec<long>::operator[](&local_100,1);
      *plVar5 = iVar4;
      TPZVec<int>::operator[](in_RDI + 1,1);
      TPZVec<int>::operator[](in_RDI + 2,1);
      iVar4 = NodeIndex(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                        in_stack_fffffffffffffde8);
      plVar5 = TPZVec<long>::operator[](&local_100,2);
      *plVar5 = iVar4;
      TPZVec<int>::operator[](in_RDI + 1,0);
      TPZVec<int>::operator[](in_RDI + 2,1);
      iVar4 = NodeIndex(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                        in_stack_fffffffffffffde8);
      plVar5 = TPZVec<long>::operator[](&local_100,3);
      *plVar5 = iVar4;
      TPZVec<long>::operator[](&local_100,(long)local_14);
      uVar2 = local_14 + 1U;
      if ((int)(local_14 + 1U) < 0) {
        uVar2 = local_14 + 4;
      }
      TPZVec<long>::operator[](&local_100,(long)(int)((local_14 + 1) - (uVar2 & 0xfffffffc)));
      TPZGeoMesh::GetBoundaryElements
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      iVar4 = TPZVec<TPZGeoEl_*>::NElements(local_88);
      for (local_110 = 0; local_110 < iVar4; local_110 = local_110 + 1) {
        this_00 = (TPZGeoElBC *)TPZVec<TPZGeoEl_*>::operator[](local_88,local_110);
        pTVar6 = (TPZGenPartialGrid *)this_00->fCreatedElement;
        if (pTVar6 != (TPZGenPartialGrid *)0x0) {
          el_00 = (TPZGeoEl *)
                  TPZVec<int>::operator[]((TPZVec<int> *)&stack0xffffffffffffff30,local_110);
          TPZGeoElBC::TPZGeoElBC(this_00,el_00,(int)((ulong)pTVar6 >> 0x20),(int)pTVar6);
          in_stack_fffffffffffffdf0 = pTVar6;
        }
      }
      TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffffdf0);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1e2a1ad);
      TPZStack<TPZGeoEl_*,_10>::~TPZStack((TPZStack<TPZGeoEl_*,_10> *)0x1e2a1ba);
    }
  }
  return;
}

Assistant:

void TPZGenPartialGrid::SetBC(TPZGeoMesh &g, int side, int bc) {
	if(side == 0 && fRangey[0] != 0) return;
	if(side == 1 && fRangex[1] != fNx[0]) return;
	if(side == 2 && fRangey[1] != fNx[1]) return;
	if(side == 3 && fRangex[0] != 0) return;
	TPZStack<TPZGeoEl*> ElementVec;
	TPZStack<int> Sides;
	TPZVec<int64_t> cornernodes(4);
	cornernodes[0] = NodeIndex(fRangex[0],fRangey[0]);
	cornernodes[1] = NodeIndex(fRangex[1],fRangey[0]);
	cornernodes[2] = NodeIndex(fRangex[1],fRangey[1]);
	cornernodes[3] = NodeIndex(fRangex[0],fRangey[1]);
	g.GetBoundaryElements(cornernodes[side],cornernodes[(side+1)%4],ElementVec, Sides);
	int64_t numel = ElementVec.NElements();
	for(int64_t el=0; el<numel; el++) {
		TPZGeoEl *gel = (TPZGeoEl *) ElementVec[el];
		if(gel) {
			TPZGeoElBC(gel,Sides[el],bc);
		}
	}
}